

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v11::basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow
               (buffer<char> *buf,size_t size)

{
  allocator<char> *b;
  allocator<char> *this;
  allocator<char> *paVar1;
  allocator<char> *n;
  buffer<char> *pbVar2;
  char *buf_data;
  size_t __n;
  allocator<char> *in_RSI;
  buffer<char> *in_RDI;
  char *new_data;
  char *old_data;
  size_t new_capacity;
  size_t old_capacity;
  size_t max_size;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *self;
  char *p;
  allocator<char> *in_stack_ffffffffffffffb0;
  buffer<char> *this_00;
  
  detail::abort_fuzzing_if(false);
  b = (allocator<char> *)
      std::allocator_traits<fmt::v11::detail::allocator<char>_>::max_size(in_stack_ffffffffffffffb0)
  ;
  this = (allocator<char> *)detail::buffer<char>::capacity(in_RDI);
  paVar1 = this + ((ulong)this >> 1);
  n = in_RSI;
  if ((in_RSI <= paVar1) && (n = paVar1, b < paVar1)) {
    n = (allocator<char> *)max_of<unsigned_long>((unsigned_long)in_RSI,(unsigned_long)b);
  }
  pbVar2 = (buffer<char> *)detail::buffer<char>::data(in_RDI);
  buf_data = detail::allocator<char>::allocate(this,(size_t)n);
  detail::buffer<char>::size(in_RDI);
  p = buf_data;
  this_00 = pbVar2;
  __n = detail::buffer<char>::size(in_RDI);
  memcpy(p,this_00,__n);
  detail::buffer<char>::set(in_RDI,buf_data,(size_t)n);
  if (pbVar2 != in_RDI + 1) {
    detail::allocator<char>::deallocate((allocator<char> *)this_00,p,0x2a8959);
  }
  return;
}

Assistant:

static FMT_CONSTEXPR20 void grow(detail::buffer<T>& buf, size_t size) {
    detail::abort_fuzzing_if(size > 5000);
    auto& self = static_cast<basic_memory_buffer&>(buf);
    const size_t max_size =
        std::allocator_traits<Allocator>::max_size(self.alloc_);
    size_t old_capacity = buf.capacity();
    size_t new_capacity = old_capacity + old_capacity / 2;
    if (size > new_capacity)
      new_capacity = size;
    else if (new_capacity > max_size)
      new_capacity = max_of(size, max_size);
    T* old_data = buf.data();
    T* new_data = self.alloc_.allocate(new_capacity);
    // Suppress a bogus -Wstringop-overflow in gcc 13.1 (#3481).
    detail::assume(buf.size() <= new_capacity);
    // The following code doesn't throw, so the raw pointer above doesn't leak.
    memcpy(new_data, old_data, buf.size() * sizeof(T));
    self.set(new_data, new_capacity);
    // deallocate must not throw according to the standard, but even if it does,
    // the buffer already uses the new storage and will deallocate it in
    // destructor.
    if (old_data != self.store_) self.alloc_.deallocate(old_data, old_capacity);
  }